

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::replace_extension(SmallVectorImpl<char> *path,Twine *extension,Style style)

{
  char cVar1;
  size_t Size;
  size_t sVar2;
  Style style_00;
  size_t sVar4;
  StringRef str;
  char local_71;
  StringRef ext;
  StringRef p;
  SmallString<32U> ext_storage;
  SmallVectorStorage<char,_32U> *pSVar3;
  
  p.Data = (char *)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  p.Length = (size_t)(path->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  pSVar3 = &ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>;
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = pSVar3;
  ext = Twine::toStringRef(extension,(SmallVectorImpl<char> *)&ext_storage);
  style_00 = (Style)pSVar3;
  sVar4 = ext.Length;
  Size = StringRef::rfind(&p,'.',0xffffffffffffffff);
  if (Size != 0xffffffffffffffff) {
    str.Length._0_4_ = style;
    str.Data = (char *)p.Length;
    str.Length._4_4_ = 0;
    sVar2 = anon_unknown.dwarf_27ffe2::filename_pos
                      ((anon_unknown_dwarf_27ffe2 *)p.Data,str,style_00);
    if (sVar2 <= Size) {
      SmallVectorBase::set_size((SmallVectorBase *)path,Size);
    }
  }
  if (sVar4 != 0) {
    cVar1 = StringRef::operator[](&ext,0);
    if (cVar1 != '.') {
      local_71 = '.';
      SmallVectorTemplateBase<char,_true>::push_back
                (&path->super_SmallVectorTemplateBase<char,_true>,&local_71);
    }
  }
  SmallVectorImpl<char>::append<char_const*,void>(path,ext.Data,ext.Data + ext.Length);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&ext_storage);
  return;
}

Assistant:

void replace_extension(SmallVectorImpl<char> &path, const Twine &extension,
                       Style style) {
  StringRef p(path.begin(), path.size());
  SmallString<32> ext_storage;
  StringRef ext = extension.toStringRef(ext_storage);

  // Erase existing extension.
  size_t pos = p.find_last_of('.');
  if (pos != StringRef::npos && pos >= filename_pos(p, style))
    path.set_size(pos);

  // Append '.' if needed.
  if (ext.size() > 0 && ext[0] != '.')
    path.push_back('.');

  // Append extension.
  path.append(ext.begin(), ext.end());
}